

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogPipe.cpp
# Opt level: O2

void __thiscall liblogger::LogPipe::LogPipe(LogPipe *this,string *command)

{
  FILE *pFVar1;
  ostream *poVar2;
  LogException *this_00;
  string sStack_1c8;
  stringstream ss;
  ostream local_198 [376];
  
  (this->super_ILogger)._vptr_ILogger = (_func_int **)&PTR__LogPipe_001526e0;
  std::__cxx11::string::string((string *)&this->m_command,(string *)command);
  pFVar1 = popen((this->m_command)._M_dataplus._M_p,"w");
  this->m_fp = (FILE *)pFVar1;
  if (pFVar1 != (FILE *)0x0) {
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar2 = std::operator<<(local_198,"failed to open pipe \'");
  poVar2 = std::operator<<(poVar2,(string *)&this->m_command);
  std::operator<<(poVar2,"\'");
  this_00 = (LogException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  LogException::LogException(this_00,&sStack_1c8);
  __cxa_throw(this_00,&LogException::typeinfo,LogException::~LogException);
}

Assistant:

LogPipe::LogPipe(const std::string &command) :
	m_command(command)
{
	m_fp = popen(m_command.c_str(), "w");
	if (!m_fp)
	{
		std::stringstream ss;
		ss << "failed to open pipe '" << m_command << "'";
		throw(LogException(ss.str()));
	}
}